

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtracer-inl.h
# Opt level: O0

void __thiscall spdlog::details::backtracer::backtracer(backtracer *this,backtracer *other)

{
  undefined1 __i;
  circular_q<spdlog::details::log_msg_buffer> *in_RDI;
  lock_guard<std::mutex> lock;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  
  std::mutex::mutex((mutex *)0x213e1d);
  std::atomic<bool>::atomic((atomic<bool> *)in_RDI,(bool)in_stack_ffffffffffffffdf);
  circular_q<spdlog::details::log_msg_buffer>::circular_q
            ((circular_q<spdlog::details::log_msg_buffer> *)0x213e3b);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  __i = enabled((backtracer *)0x213e56);
  std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)__i);
  circular_q<spdlog::details::log_msg_buffer>::operator=
            (in_RDI,(circular_q<spdlog::details::log_msg_buffer> *)
                    CONCAT17(__i,in_stack_ffffffffffffffd8));
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x213e95);
  return;
}

Assistant:

SPDLOG_INLINE backtracer::backtracer(backtracer &&other) SPDLOG_NOEXCEPT
{
    std::lock_guard<std::mutex> lock(other.mutex_);
    enabled_ = other.enabled();
    messages_ = std::move(other.messages_);
}